

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

float mpack_node_float_strict(mpack_node_t node)

{
  mpack_tree_t *pmVar1;
  
  pmVar1 = node.tree;
  if (pmVar1->error == mpack_ok) {
    if ((node.data)->type == mpack_type_float) {
      return ((node.data)->value).f;
    }
    pmVar1->error = mpack_error_type;
    if (pmVar1->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar1->error_fn)(pmVar1,mpack_error_type);
      return 0.0;
    }
  }
  return 0.0;
}

Assistant:

MPACK_INLINE float mpack_node_float_strict(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0f;

    if (node.data->type == mpack_type_float)
        return node.data->value.f;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0f;
}